

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-test.cc
# Opt level: O3

void __thiscall
NumericArgTest_MakeAndVisit_Test<unsigned_int>::TestBody
          (NumericArgTest_MakeAndVisit_Test<unsigned_int> *this)

{
  mock_visitor<unsigned_int> *pmVar1;
  MockSpec<test_result_(unsigned_int)> *pMVar2;
  basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  arg;
  StrictMock<mock_visitor<unsigned_int>_> visitor;
  basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
  local_108;
  StrictMock<mock_visitor<unsigned_int>_> local_e0;
  
  testing::StrictMock<mock_visitor<unsigned_int>_>::StrictMock(&local_e0);
  testing::Matcher<unsigned_int>::Matcher((Matcher<unsigned_int> *)&local_108,0x2a);
  pmVar1 = &local_e0.super_mock_visitor<unsigned_int>;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)pmVar1,pmVar1);
  pMVar2 = testing::internal::FunctionMocker<test_result_(unsigned_int)>::With
                     (&pmVar1->gmock1_visit_268,(Matcher<unsigned_int> *)&local_108);
  testing::internal::MockSpec<test_result_(unsigned_int)>::InternalExpectedAt
            (pMVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/core-test.cc"
             ,0x152,"visitor","visit(expected)");
  local_108.value_.field_0.double_value = (double)&PTR__MatcherBase_001d5580;
  testing::internal::linked_ptr<const_testing::MatcherInterface<unsigned_int>_>::~linked_ptr
            ((linked_ptr<const_testing::MatcherInterface<unsigned_int>_> *)
             ((long)&local_108.value_.field_0 + 8));
  local_108.type_ = uint_type;
  local_108.value_.field_0.long_long_value = (longlong)&DAT_0000002a;
  fmt::v5::
  visit_format_arg<testing::StrictMock<mock_visitor<unsigned_int>>&,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            (&local_e0,
             (basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
              *)&local_108);
  testing::StrictMock<mock_visitor<unsigned_int>_>::~StrictMock(&local_e0);
  testing::StrictMock<mock_visitor<unsigned_int>_>::StrictMock(&local_e0);
  testing::Matcher<unsigned_int>::Matcher((Matcher<unsigned_int> *)&local_108,0x2a);
  pmVar1 = &local_e0.super_mock_visitor<unsigned_int>;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)pmVar1,pmVar1);
  pMVar2 = testing::internal::FunctionMocker<test_result_(unsigned_int)>::With
                     (&pmVar1->gmock1_visit_268,(Matcher<unsigned_int> *)&local_108);
  testing::internal::MockSpec<test_result_(unsigned_int)>::InternalExpectedAt
            (pMVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/core-test.cc"
             ,0x152,"visitor","visit(expected)");
  local_108.value_.field_0.double_value = (double)&PTR__MatcherBase_001d5580;
  testing::internal::linked_ptr<const_testing::MatcherInterface<unsigned_int>_>::~linked_ptr
            ((linked_ptr<const_testing::MatcherInterface<unsigned_int>_> *)
             ((long)&local_108.value_.field_0 + 8));
  local_108.type_ = uint_type;
  local_108.value_.field_0.long_long_value = (longlong)&DAT_0000002a;
  fmt::v5::
  visit_format_arg<testing::StrictMock<mock_visitor<unsigned_int>>&,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>
            (&local_e0,&local_108);
  testing::StrictMock<mock_visitor<unsigned_int>_>::~StrictMock(&local_e0);
  testing::StrictMock<mock_visitor<unsigned_int>_>::StrictMock(&local_e0);
  testing::Matcher<unsigned_int>::Matcher((Matcher<unsigned_int> *)&local_108,0);
  pmVar1 = &local_e0.super_mock_visitor<unsigned_int>;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)pmVar1,pmVar1);
  pMVar2 = testing::internal::FunctionMocker<test_result_(unsigned_int)>::With
                     (&pmVar1->gmock1_visit_268,(Matcher<unsigned_int> *)&local_108);
  testing::internal::MockSpec<test_result_(unsigned_int)>::InternalExpectedAt
            (pMVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/core-test.cc"
             ,0x153,"visitor","visit(expected)");
  local_108.value_.field_0.double_value = (double)&PTR__MatcherBase_001d5580;
  testing::internal::linked_ptr<const_testing::MatcherInterface<unsigned_int>_>::~linked_ptr
            ((linked_ptr<const_testing::MatcherInterface<unsigned_int>_> *)
             ((long)&local_108.value_.field_0 + 8));
  local_108.type_ = uint_type;
  local_108.value_.field_0.long_long_value = 0;
  fmt::v5::
  visit_format_arg<testing::StrictMock<mock_visitor<unsigned_int>>&,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            (&local_e0,
             (basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
              *)&local_108);
  testing::StrictMock<mock_visitor<unsigned_int>_>::~StrictMock(&local_e0);
  testing::StrictMock<mock_visitor<unsigned_int>_>::StrictMock(&local_e0);
  testing::Matcher<unsigned_int>::Matcher((Matcher<unsigned_int> *)&local_108,0);
  pmVar1 = &local_e0.super_mock_visitor<unsigned_int>;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)pmVar1,pmVar1);
  pMVar2 = testing::internal::FunctionMocker<test_result_(unsigned_int)>::With
                     (&pmVar1->gmock1_visit_268,(Matcher<unsigned_int> *)&local_108);
  testing::internal::MockSpec<test_result_(unsigned_int)>::InternalExpectedAt
            (pMVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/core-test.cc"
             ,0x153,"visitor","visit(expected)");
  local_108.value_.field_0.double_value = (double)&PTR__MatcherBase_001d5580;
  testing::internal::linked_ptr<const_testing::MatcherInterface<unsigned_int>_>::~linked_ptr
            ((linked_ptr<const_testing::MatcherInterface<unsigned_int>_> *)
             ((long)&local_108.value_.field_0 + 8));
  local_108.type_ = uint_type;
  local_108.value_.field_0.long_long_value = 0;
  fmt::v5::
  visit_format_arg<testing::StrictMock<mock_visitor<unsigned_int>>&,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>
            (&local_e0,&local_108);
  testing::StrictMock<mock_visitor<unsigned_int>_>::~StrictMock(&local_e0);
  testing::StrictMock<mock_visitor<unsigned_int>_>::StrictMock(&local_e0);
  testing::Matcher<unsigned_int>::Matcher((Matcher<unsigned_int> *)&local_108,0xffffffff);
  pmVar1 = &local_e0.super_mock_visitor<unsigned_int>;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)pmVar1,pmVar1);
  pMVar2 = testing::internal::FunctionMocker<test_result_(unsigned_int)>::With
                     (&pmVar1->gmock1_visit_268,(Matcher<unsigned_int> *)&local_108);
  testing::internal::MockSpec<test_result_(unsigned_int)>::InternalExpectedAt
            (pMVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/core-test.cc"
             ,0x154,"visitor","visit(expected)");
  local_108.value_.field_0.double_value = (double)&PTR__MatcherBase_001d5580;
  testing::internal::linked_ptr<const_testing::MatcherInterface<unsigned_int>_>::~linked_ptr
            ((linked_ptr<const_testing::MatcherInterface<unsigned_int>_> *)
             ((long)&local_108.value_.field_0 + 8));
  local_108.type_ = uint_type;
  local_108.value_.field_0.long_long_value = 0xffffffff;
  fmt::v5::
  visit_format_arg<testing::StrictMock<mock_visitor<unsigned_int>>&,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            (&local_e0,
             (basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
              *)&local_108);
  testing::StrictMock<mock_visitor<unsigned_int>_>::~StrictMock(&local_e0);
  testing::StrictMock<mock_visitor<unsigned_int>_>::StrictMock(&local_e0);
  testing::Matcher<unsigned_int>::Matcher((Matcher<unsigned_int> *)&local_108,0xffffffff);
  pmVar1 = &local_e0.super_mock_visitor<unsigned_int>;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)pmVar1,pmVar1);
  pMVar2 = testing::internal::FunctionMocker<test_result_(unsigned_int)>::With
                     (&pmVar1->gmock1_visit_268,(Matcher<unsigned_int> *)&local_108);
  testing::internal::MockSpec<test_result_(unsigned_int)>::InternalExpectedAt
            (pMVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/core-test.cc"
             ,0x154,"visitor","visit(expected)");
  local_108.value_.field_0.double_value = (double)&PTR__MatcherBase_001d5580;
  testing::internal::linked_ptr<const_testing::MatcherInterface<unsigned_int>_>::~linked_ptr
            ((linked_ptr<const_testing::MatcherInterface<unsigned_int>_> *)
             ((long)&local_108.value_.field_0 + 8));
  local_108.type_ = uint_type;
  local_108.value_.field_0.long_long_value = 0xffffffff;
  fmt::v5::
  visit_format_arg<testing::StrictMock<mock_visitor<unsigned_int>>&,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>
            (&local_e0,&local_108);
  testing::StrictMock<mock_visitor<unsigned_int>_>::~StrictMock(&local_e0);
  return;
}

Assistant:

TYPED_TEST(NumericArgTest, MakeAndVisit) {
  CHECK_ARG(test_value<TypeParam>(), typename);
  CHECK_ARG(std::numeric_limits<TypeParam>::min(), typename);
  CHECK_ARG(std::numeric_limits<TypeParam>::max(), typename);
}